

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# torrent.cpp
# Opt level: O0

void __thiscall libtorrent::aux::torrent::do_connect_boost(torrent *this)

{
  session_interface *psVar1;
  external_ip *peVar2;
  torrent_peer *this_00;
  bool bVar3;
  int iVar4;
  int iVar5;
  uint uVar6;
  uint32_t uVar7;
  session_settings *this_01;
  int *piVar8;
  pointer ppVar9;
  undefined8 uVar10;
  undefined8 uVar11;
  endpoint *ep;
  address *addr;
  enable_shared_from_this<libtorrent::aux::torrent> local_230;
  weak_ptr<libtorrent::aux::torrent> local_220;
  address local_210;
  address local_1f0;
  string local_1d0;
  endpoint local_1ac;
  string local_190;
  external_ip local_170;
  external_ip *local_f0;
  external_ip *external;
  torrent_peer *local_d8;
  torrent_peer *p;
  torrent_state st;
  uint local_18;
  int local_14;
  torrent *ptStack_10;
  int conns;
  torrent *this_local;
  
  if (this->m_connect_boost_counter != '\0') {
    local_18 = (uint)this->m_connect_boost_counter;
    ptStack_10 = this;
    this_01 = settings(this);
    iVar4 = session_settings::get_int(this_01,0x4055);
    iVar5 = (*(((this->super_torrent_hot_members).m_ses)->super_session_logger)._vptr_session_logger
              [0x1e])();
    st.erased.
    super__Vector_base<libtorrent::aux::torrent_peer_*,_std::allocator<libtorrent::aux::torrent_peer_*>_>
    ._M_impl.super__Vector_impl_data._M_end_of_storage._4_4_ = iVar4 - iVar5;
    piVar8 = ::std::min<int>((int *)&local_18,
                             (int *)((long)&st.erased.
                                            super__Vector_base<libtorrent::aux::torrent_peer_*,_std::allocator<libtorrent::aux::torrent_peer_*>_>
                                            ._M_impl.super__Vector_impl_data._M_end_of_storage + 4))
    ;
    local_14 = *piVar8;
    if ((local_14 != 0) &&
       (bVar3 = ::std::unique_ptr::operator_cast_to_bool
                          ((unique_ptr *)&(this->super_torrent_hot_members).m_peer_list), bVar3)) {
      while (bVar3 = want_peers(this), bVar3 && 0 < local_14) {
        local_14 = local_14 + -1;
        this->m_connect_boost_counter = this->m_connect_boost_counter + 0xff;
        get_peer_list_state((torrent_state *)&p,this);
        ppVar9 = ::std::
                 unique_ptr<libtorrent::aux::peer_list,_std::default_delete<libtorrent::aux::peer_list>_>
                 ::operator->(&(this->super_torrent_hot_members).m_peer_list);
        uVar6 = (*(((this->super_torrent_hot_members).m_ses)->super_session_logger).
                  _vptr_session_logger[0xf])();
        local_d8 = peer_list::connect_one_peer(ppVar9,uVar6 & 0xffff,(torrent_state *)&p);
        peers_erased(this,(vector<libtorrent::aux::torrent_peer_*,_std::allocator<libtorrent::aux::torrent_peer_*>_>
                           *)&st.port);
        inc_stats_counter(this,0x34,st.max_peerlist_size);
        if (local_d8 == (torrent_peer *)0x0) {
          update_want_peers(this);
          external._0_4_ = 2;
        }
        else {
          uVar6 = (*(this->super_request_callback)._vptr_request_callback[6])();
          if ((uVar6 & 1) != 0) {
            (*(((this->super_torrent_hot_members).m_ses)->super_session_logger)._vptr_session_logger
              [3])(&local_170);
            local_f0 = &local_170;
            torrent_peer::ip(&local_1ac,local_d8);
            print_endpoint_abi_cxx11_(&local_190,(aux *)&local_1ac,ep);
            uVar10 = ::std::__cxx11::string::c_str();
            this_00 = local_d8;
            peVar2 = local_f0;
            uVar6 = (*(((this->super_torrent_hot_members).m_ses)->super_session_logger).
                      _vptr_session_logger[0x20])();
            uVar7 = torrent_peer::rank(this_00,peVar2,uVar6 & 0xffff);
            peVar2 = local_f0;
            torrent_peer::address(&local_210,local_d8);
            external_ip::external_address(&local_1f0,peVar2,&local_210);
            print_address_abi_cxx11_(&local_1d0,(aux *)&local_1f0,addr);
            uVar11 = ::std::__cxx11::string::c_str();
            uVar6 = (*(((this->super_torrent_hot_members).m_ses)->super_session_logger).
                      _vptr_session_logger[0xf])();
            (*(this->super_request_callback)._vptr_request_callback[7])
                      (this," *** FOUND CONNECTION CANDIDATE [ ip: %s rank: %u external: %s t: %d ]"
                       ,uVar10,(ulong)uVar7,uVar11,
                       (ulong)((uVar6 & 0xffff) - (uint)local_d8->last_connected));
            ::std::__cxx11::string::~string((string *)&local_1d0);
            ::std::__cxx11::string::~string((string *)&local_190);
          }
          bVar3 = connect_to_peer(this,local_d8,false);
          if (bVar3) {
            (*(((this->super_torrent_hot_members).m_ses)->super_session_logger)._vptr_session_logger
              [0x40])();
            update_want_peers(this);
          }
          else {
            ppVar9 = ::std::
                     unique_ptr<libtorrent::aux::peer_list,_std::default_delete<libtorrent::aux::peer_list>_>
                     ::operator->(&(this->super_torrent_hot_members).m_peer_list);
            peer_list::inc_failcount(ppVar9,local_d8);
            update_want_peers(this);
          }
          external._0_4_ = 0;
        }
        torrent_state::~torrent_state((torrent_state *)&p);
      }
      bVar3 = want_peers(this);
      if (bVar3) {
        psVar1 = (this->super_torrent_hot_members).m_ses;
        ::std::enable_shared_from_this<libtorrent::aux::torrent>::shared_from_this(&local_230);
        ::std::weak_ptr<libtorrent::aux::torrent>::weak_ptr<libtorrent::aux::torrent,void>
                  (&local_220,(shared_ptr<libtorrent::aux::torrent> *)&local_230);
        (*(psVar1->super_session_logger)._vptr_session_logger[0x2b])(psVar1,&local_220);
        ::std::weak_ptr<libtorrent::aux::torrent>::~weak_ptr(&local_220);
        ::std::shared_ptr<libtorrent::aux::torrent>::~shared_ptr
                  ((shared_ptr<libtorrent::aux::torrent> *)&local_230);
      }
    }
  }
  return;
}

Assistant:

void torrent::do_connect_boost()
	{
		if (m_connect_boost_counter == 0) return;

		// this is the first tracker response for this torrent
		// instead of waiting one second for session_impl::on_tick()
		// to be called, connect to a few peers immediately
		int conns = std::min(int(m_connect_boost_counter)
			, settings().get_int(settings_pack::connections_limit) - m_ses.num_connections());

		if (conns == 0) return;

		// if we don't know of any peers
		if (!m_peer_list) return;

		while (want_peers() && conns > 0)
		{
			TORRENT_ASSERT(m_connect_boost_counter > 0);
			--conns;
			--m_connect_boost_counter;
			torrent_state st = get_peer_list_state();
			torrent_peer* p = m_peer_list->connect_one_peer(m_ses.session_time(), &st);
			peers_erased(st.erased);
			inc_stats_counter(counters::connection_attempt_loops, st.loop_counter);
			if (p == nullptr)
			{
				update_want_peers();
				continue;
			}

#ifndef TORRENT_DISABLE_LOGGING
			if (should_log())
			{
				external_ip const& external = m_ses.external_address();
				debug_log(" *** FOUND CONNECTION CANDIDATE ["
					" ip: %s rank: %u external: %s t: %d ]"
					, print_endpoint(p->ip()).c_str()
					, p->rank(external, m_ses.listen_port())
					, print_address(external.external_address(p->address())).c_str()
					, int(m_ses.session_time() - p->last_connected));
			}
#endif

			if (!connect_to_peer(p))
			{
				m_peer_list->inc_failcount(p);
				update_want_peers();
			}
			else
			{
				// increase m_ses.m_boost_connections for each connection
				// attempt. This will be deducted from the connect speed
				// the next time session_impl::on_tick() is triggered
				m_ses.inc_boost_connections();
				update_want_peers();
			}
		}

		if (want_peers()) m_ses.prioritize_connections(shared_from_this());
	}